

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O3

ArgString * __thiscall Potassco::ArgString::get<Clasp::MovingAvg::Type>(ArgString *this,Type *x)

{
  char *pcVar1;
  KV *pKVar2;
  char *next;
  KV *local_18;
  
  pcVar1 = this->in;
  if (pcVar1 != (char *)0x0) {
    local_18 = (KV *)(pcVar1 + (*pcVar1 == this->skip));
    pKVar2 = findValue((Potassco *)Clasp::enumMap(Clasp::MovingAvg::Type_const*)::map,
                       (Span<Potassco::KV> *)0x5,(char *)local_18,(char **)&local_18,",");
    if (pKVar2 != (KV *)0x0) {
      *x = pKVar2->value;
      pKVar2 = local_18;
    }
    this->in = (char *)pKVar2;
    this->skip = ',';
  }
  return this;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}